

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS ref_egads_open(REF_GEOM ref_geom)

{
  ref_geom->context = (void *)0x0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_open(REF_GEOM ref_geom) {
#ifdef HAVE_EGADS
  ego context;
  REIS(EGADS_SUCCESS, EG_open(&context), "EG open");
  /* Success returns the old output level. (0-silent to 3-debug) */
  RAS(EG_setOutLevel(context, 0) >= 0, "make silent");
  ref_geom->context = (void *)context;
#else
  ref_geom->context = NULL;
#endif
  return REF_SUCCESS;
}